

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

ISceneNode * __thiscall
irr::scene::CSceneManager::getSceneNodeFromId(CSceneManager *this,s32 id,ISceneNode *start)

{
  bool bVar1;
  int iVar2;
  reference ppIVar3;
  ISceneNode *in_RDX;
  int in_ESI;
  long *in_RDI;
  const_iterator it;
  ISceneNodeList *list;
  ISceneNode *node;
  list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
  *in_stack_ffffffffffffffa8;
  _Self local_40;
  _Self local_38;
  list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *local_30;
  ISceneNode *local_28;
  ISceneNode *local_20;
  int local_14;
  ISceneNode *local_8;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  if (in_RDX == (ISceneNode *)0x0) {
    local_20 = (ISceneNode *)(**(code **)(*in_RDI + 0x48))();
  }
  iVar2 = (*local_20->_vptr_ISceneNode[0xf])();
  if (iVar2 == local_14) {
    local_8 = local_20;
  }
  else {
    local_28 = (ISceneNode *)0x0;
    local_30 = ISceneNode::getChildren_abi_cxx11_(local_20);
    local_38._M_node =
         (_List_node_base *)
         ::std::__cxx11::list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::
         begin(in_stack_ffffffffffffffa8);
    while( true ) {
      local_40._M_node =
           (_List_node_base *)
           ::std::__cxx11::list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
           ::end(in_stack_ffffffffffffffa8);
      bVar1 = ::std::operator!=(&local_38,&local_40);
      iVar2 = local_14;
      if (!bVar1) break;
      ppIVar3 = ::std::_List_const_iterator<irr::scene::ISceneNode_*>::operator*
                          ((_List_const_iterator<irr::scene::ISceneNode_*> *)0x2fbc81);
      local_28 = (ISceneNode *)(**(code **)(*in_RDI + 0x50))(in_RDI,iVar2,*ppIVar3);
      if (local_28 != (ISceneNode *)0x0) {
        return local_28;
      }
      ::std::_List_const_iterator<irr::scene::ISceneNode_*>::operator++(&local_38);
    }
    local_8 = (ISceneNode *)0x0;
  }
  return local_8;
}

Assistant:

ISceneNode *CSceneManager::getSceneNodeFromId(s32 id, ISceneNode *start)
{
	if (start == 0)
		start = getRootSceneNode();

	if (start->getID() == id)
		return start;

	ISceneNode *node = 0;

	const ISceneNodeList &list = start->getChildren();
	ISceneNodeList::const_iterator it = list.begin();
	for (; it != list.end(); ++it) {
		node = getSceneNodeFromId(id, *it);
		if (node)
			return node;
	}

	return 0;
}